

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# List.hpp
# Opt level: O2

void __thiscall List<Callback::Emitter::Slot>::clear(List<Callback::Emitter::Slot> *this)

{
  Item *pIVar1;
  Item *pIVar2;
  Iterator *pIVar3;
  
  pIVar3 = &this->_begin;
  pIVar2 = this->freeItem;
  while (pIVar1 = pIVar3->item, pIVar1 != &this->endItem) {
    pIVar1->prev = pIVar2;
    this->freeItem = pIVar1;
    pIVar2 = pIVar1;
    pIVar3 = (Iterator *)&pIVar1->next;
  }
  (this->_begin).item = &this->endItem;
  (this->endItem).prev = (Item *)0x0;
  this->_size = 0;
  return;
}

Assistant:

void clear()
  {
    for(Item* i = _begin.item, * end = &endItem; i != end; i = i->next)
    {
      i->~Item();
      i->prev = freeItem;
      freeItem = i;
    }
    _begin.item = &endItem;
    endItem.prev = 0;
    _size = 0;
  }